

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_seed.c
# Opt level: O2

long sd_order(int child,long skip_count)

{
  NthElement(skip_count,&Seed[0x2b].value);
  NthElement(skip_count,&Seed[0x28].value);
  NthElement(Seed[0xc].boundary * skip_count,&Seed[0xc].value);
  NthElement(skip_count,&Seed[10].value);
  NthElement(skip_count,&Seed[0xb].value);
  NthElement(skip_count,&Seed[0x26].value);
  NthElement(skip_count,&Seed[0xd].value);
  return 0;
}

Assistant:

long 
sd_order(int child, long skip_count)        
{
   UNUSED(child);
   ADVANCE_STREAM(O_LCNT_SD, skip_count);
   ADVANCE_STREAM(O_CKEY_SD, skip_count);
   FAKE_V_STR(O_CMNT_LEN, O_CMNT_SD, skip_count);
   ADVANCE_STREAM(O_SUPP_SD, skip_count);
   ADVANCE_STREAM(O_CLRK_SD, skip_count);
   ADVANCE_STREAM(O_PRIO_SD, skip_count);
   ADVANCE_STREAM(O_ODATE_SD, skip_count);

   return (0L);
}